

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall cs222::Parser::parseLabel(Parser *this,string *token,string *label)

{
  bool bVar1;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *label_local;
  string *token_local;
  Parser *this_local;
  
  local_20 = label;
  label_local = token;
  token_local = (string *)this;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (token,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                           label_regex_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_20,(string *)label_local);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"illegal symbol name: ",&local_61);
    std::operator+(&local_40,&local_60,label_local);
    throwError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return;
}

Assistant:

void Parser::parseLabel(const std::string& token, std::string& label) const
    {
        if (std::regex_match(token, label_regex))
        {
            label = token;
        }
        else
        {
            throwError(std::string("illegal symbol name: ") + token);
        }
    }